

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEngine::initialize
          (QNativeSocketEngine *this,qintptr socketDescriptor,SocketState socketState)

{
  bool bVar1;
  QNativeSocketEnginePrivate *pQVar2;
  ulong uVar3;
  SocketState in_EDX;
  qintptr in_RSI;
  long *in_RDI;
  QNativeSocketEnginePrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  
  pQVar2 = d_func((QNativeSocketEngine *)0x25f065);
  uVar3 = (**(code **)(*in_RDI + 0x78))();
  if ((uVar3 & 1) != 0) {
    (**(code **)(*in_RDI + 0xa8))();
  }
  pQVar2->socketDescriptor = in_RSI;
  bVar1 = QNativeSocketEnginePrivate::fetchConnectionParameters
                    ((QNativeSocketEnginePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (!bVar1) {
    pQVar2->socketDescriptor = -1;
    return false;
  }
  if ((pQVar2->super_QAbstractSocketEnginePrivate).socketType != UnknownSocketType) {
    uVar3 = (**(code **)(*in_RDI + 0x118))(in_RDI,0,1);
    if ((uVar3 & 1) == 0) {
      QNativeSocketEnginePrivate::setError
                ((QNativeSocketEnginePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                 (SocketError)((ulong)pQVar2 >> 0x20),(ErrorString)pQVar2);
      (**(code **)(*in_RDI + 0xa8))();
      return false;
    }
    if (((pQVar2->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) &&
       (uVar3 = (**(code **)(*in_RDI + 0x118))(in_RDI,1), (uVar3 & 1) == 0)) {
      QNativeSocketEnginePrivate::setError
                ((QNativeSocketEnginePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                 (SocketError)((ulong)pQVar2 >> 0x20),(ErrorString)pQVar2);
      (**(code **)(*in_RDI + 0xa8))();
      return false;
    }
  }
  (pQVar2->super_QAbstractSocketEnginePrivate).socketState = in_EDX;
  return true;
}

Assistant:

bool QNativeSocketEngine::initialize(qintptr socketDescriptor, QAbstractSocket::SocketState socketState)
{
    Q_D(QNativeSocketEngine);

    if (isValid())
        close();

    d->socketDescriptor = socketDescriptor;

    // determine socket type and protocol
    if (!d->fetchConnectionParameters()) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug() << "QNativeSocketEngine::initialize(socketDescriptor) failed:"
                 << socketDescriptor << d->socketErrorString;
#endif
        d->socketDescriptor = -1;
        return false;
    }

    if (d->socketType != QAbstractSocket::UnknownSocketType) {
        // Make the socket nonblocking.
        if (!setOption(NonBlockingSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                QNativeSocketEnginePrivate::NonBlockingInitFailedErrorString);
            close();
            return false;
        }

        // Set the broadcasting flag if it's a UDP socket.
        if (d->socketType == QAbstractSocket::UdpSocket
            && !setOption(BroadcastSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                QNativeSocketEnginePrivate::BroadcastingInitFailedErrorString);
            close();
            return false;
        }
    }

    d->socketState = socketState;
    return true;
}